

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t exr_attr_list_compute_size(exr_context_t ctxt,exr_attribute_list_t *list,uint64_t *out)

{
  exr_attribute_t *peVar1;
  exr_attr_opaquedata_t *u;
  bool bVar2;
  uint uVar3;
  int iVar4;
  exr_result_t eVar5;
  long lVar6;
  code *UNRECOVERED_JUMPTABLE;
  long lVar7;
  char *pcVar8;
  uint64_t uVar9;
  ulong in_R9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  int32_t sz;
  int32_t local_3c;
  ulong local_38;
  
  eVar5 = (exr_result_t)in_R9;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (list == (exr_attribute_list_t *)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar8 = "Missing list to compute size";
  }
  else {
    if (out != (uint64_t *)0x0) {
      *out = 0;
      bVar2 = 0 < list->num_attributes;
      if (list->num_attributes < 1) {
        uVar10 = 0;
        uVar9 = 0;
      }
      else {
        lVar11 = 0;
        uVar9 = 0;
        uVar10 = 0;
        do {
          peVar1 = list->entries[lVar11];
          lVar6 = peVar1->name_length + uVar9;
          uVar9 = (ulong)peVar1->type_name_length + lVar6 + 6;
          if (0x1c < peVar1->type - EXR_ATTR_BOX2I) {
            bVar12 = false;
            local_38 = uVar10;
            uVar3 = (**(code **)(ctxt + 0x48))
                              (ctxt,3,
                               "Invalid / unhandled type \'%s\' for attribute \'%s\', unable to compute size"
                               ,peVar1->type_name,peVar1->name);
            in_R9 = (ulong)uVar3;
            uVar10 = local_38;
            goto LAB_0011151f;
          }
          lVar6 = lVar6 + (ulong)peVar1->type_name_length;
          switch(peVar1->type) {
          case EXR_ATTR_BOX2I:
          case EXR_ATTR_BOX2F:
          case EXR_ATTR_V2D:
            uVar9 = lVar6 + 0x16;
            break;
          case EXR_ATTR_CHLIST:
            lVar6 = (long)((peVar1->field_6).chlist)->num_channels;
            bVar12 = true;
            if (0 < lVar6) {
              lVar7 = 0;
              do {
                uVar9 = uVar9 + (long)*(int *)(((peVar1->field_6).chlist)->entries->reserved +
                                              lVar7 + -0x15) + 0x11;
                lVar7 = lVar7 + 0x20;
              } while (lVar6 * 0x20 != lVar7);
            }
            goto LAB_0011151f;
          case EXR_ATTR_CHROMATICITIES:
            uVar9 = lVar6 + 0x26;
            break;
          case EXR_ATTR_COMPRESSION:
          case EXR_ATTR_ENVMAP:
          case EXR_ATTR_LINEORDER:
            uVar9 = lVar6 + 7;
            break;
          default:
            uVar9 = lVar6 + 0xe;
            break;
          case EXR_ATTR_FLOAT:
          case EXR_ATTR_INT:
            uVar9 = lVar6 + 10;
            break;
          case EXR_ATTR_FLOAT_VECTOR:
            lVar6 = (long)((peVar1->field_6).chlist)->num_channels;
            goto LAB_001114fa;
          case EXR_ATTR_KEYCODE:
            uVar9 = lVar6 + 0x22;
            break;
          case EXR_ATTR_M33F:
            uVar9 = lVar6 + 0x2a;
            break;
          case EXR_ATTR_M33D:
            uVar9 = lVar6 + 0x4e;
            break;
          case EXR_ATTR_M44F:
            uVar9 = lVar6 + 0x46;
            break;
          case EXR_ATTR_M44D:
            uVar9 = lVar6 + 0x86;
            break;
          case EXR_ATTR_PREVIEW:
            lVar6 = (ulong)((peVar1->field_6).preview)->height *
                    (ulong)((peVar1->field_6).preview)->width;
LAB_001114fa:
            uVar9 = uVar9 + lVar6 * 4;
            goto LAB_00111551;
          case EXR_ATTR_STRING:
            iVar4 = ((peVar1->field_6).chlist)->num_channels;
LAB_0011154e:
            uVar9 = uVar9 + (long)iVar4;
            goto LAB_00111551;
          case EXR_ATTR_STRING_VECTOR:
            lVar6 = (long)((peVar1->field_6).chlist)->num_channels;
            bVar12 = true;
            if (0 < lVar6) {
              lVar7 = 0;
              do {
                uVar9 = uVar9 + (long)*(int *)(((peVar1->field_6).chlist)->entries->reserved +
                                              lVar7 + -0x15) + 4;
                lVar7 = lVar7 + 0x10;
              } while (lVar6 * 0x10 != lVar7);
            }
            goto LAB_0011151f;
          case EXR_ATTR_TILEDESC:
            uVar9 = lVar6 + 0xf;
            break;
          case EXR_ATTR_V3I:
          case EXR_ATTR_V3F:
            uVar9 = lVar6 + 0x12;
            break;
          case EXR_ATTR_V3D:
            uVar9 = lVar6 + 0x1e;
            break;
          case EXR_ATTR_OPAQUE:
            u = (peVar1->field_6).opaque;
            if (u->packed_data != (void *)0x0) {
              iVar4 = u->size;
              goto LAB_0011154e;
            }
            if (u->unpacked_data != (void *)0x0) {
              local_3c = 0;
              uVar3 = exr_attr_opaquedata_pack(ctxt,u,&local_3c,(void **)0x0);
              uVar10 = (ulong)uVar3;
              bVar12 = uVar3 == 0;
              iVar4 = 0;
              if (bVar12) {
                iVar4 = local_3c;
              }
              in_R9 = in_R9 & 0xffffffff;
              if (!bVar12) {
                in_R9 = uVar10;
              }
              uVar9 = uVar9 + (long)iVar4;
              goto LAB_0011151f;
            }
LAB_00111551:
            bVar12 = true;
            goto LAB_0011151f;
          }
          bVar12 = true;
LAB_0011151f:
          eVar5 = (exr_result_t)in_R9;
          if (!bVar12) break;
          lVar11 = lVar11 + 1;
          bVar2 = lVar11 < list->num_attributes;
        } while (lVar11 < list->num_attributes);
      }
      if (bVar2) {
        return eVar5;
      }
      *out = uVar9;
      return (exr_result_t)uVar10;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
    pcVar8 = "Expected output pointer";
  }
  eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar8);
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_list_compute_size (
    exr_context_t ctxt, exr_attribute_list_t* list, uint64_t* out)
{
    uint64_t     retval = 0;
    exr_result_t rv     = EXR_ERR_SUCCESS;

    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);

    if (!list)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Missing list to compute size");

    if (!out)
        return pctxt->report_error (
            pctxt, EXR_ERR_INVALID_ARGUMENT, "Expected output pointer");

    *out = 0;
    for (int i = 0; i < list->num_attributes; ++i)
    {
        const exr_attribute_t* cur = list->entries[i];
        retval += (size_t) cur->name_length + 1;
        retval += (size_t) cur->type_name_length + 1;
        retval += sizeof (int32_t);
        switch (cur->type)
        {
            case EXR_ATTR_BOX2I: retval += sizeof (*(cur->box2i)); break;
            case EXR_ATTR_BOX2F: retval += sizeof (*(cur->box2f)); break;
            case EXR_ATTR_CHLIST:
                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    retval += (size_t) cur->chlist->entries[c].name.length + 1;
                    retval += sizeof (int32_t) * 4;
                }
                break;
            case EXR_ATTR_CHROMATICITIES:
                retval += sizeof (*(cur->chromaticities));
                break;
            case EXR_ATTR_COMPRESSION:
            case EXR_ATTR_ENVMAP:
            case EXR_ATTR_LINEORDER: retval += sizeof (uint8_t); break;
            case EXR_ATTR_DOUBLE: retval += sizeof (double); break;
            case EXR_ATTR_FLOAT: retval += sizeof (float); break;
            case EXR_ATTR_FLOAT_VECTOR:
                retval += sizeof (float) * (size_t) (cur->floatvector->length);
                break;
            case EXR_ATTR_INT: retval += sizeof (int32_t); break;
            case EXR_ATTR_KEYCODE: retval += sizeof (*(cur->keycode)); break;
            case EXR_ATTR_M33F: retval += sizeof (*(cur->m33f)); break;
            case EXR_ATTR_M33D: retval += sizeof (*(cur->m33d)); break;
            case EXR_ATTR_M44F: retval += sizeof (*(cur->m44f)); break;
            case EXR_ATTR_M44D: retval += sizeof (*(cur->m44d)); break;
            case EXR_ATTR_PREVIEW:
                retval += (size_t) cur->preview->width *
                          (size_t) cur->preview->height * (size_t) 4;
                break;
            case EXR_ATTR_RATIONAL: retval += sizeof (*(cur->rational)); break;
            case EXR_ATTR_STRING: retval += (size_t) cur->string->length; break;
            case EXR_ATTR_STRING_VECTOR:
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    retval += (size_t) cur->stringvector->strings[s].length;
                    retval += sizeof (int32_t);
                }
                break;
            case EXR_ATTR_TILEDESC: retval += sizeof (*(cur->tiledesc)); break;
            case EXR_ATTR_TIMECODE: retval += sizeof (*(cur->timecode)); break;
            case EXR_ATTR_V2I: retval += sizeof (*(cur->v2i)); break;
            case EXR_ATTR_V2F: retval += sizeof (*(cur->v2f)); break;
            case EXR_ATTR_V2D: retval += sizeof (*(cur->v2d)); break;
            case EXR_ATTR_V3I: retval += sizeof (*(cur->v3i)); break;
            case EXR_ATTR_V3F: retval += sizeof (*(cur->v3f)); break;
            case EXR_ATTR_V3D: retval += sizeof (*(cur->v3d)); break;
            case EXR_ATTR_OPAQUE:
                if (cur->opaque->packed_data)
                    retval += (size_t) cur->opaque->size;
                else if (cur->opaque->unpacked_data)
                {
                    int32_t sz = 0;
                    rv =
                        exr_attr_opaquedata_pack (ctxt, cur->opaque, &sz, NULL);
                    if (rv != EXR_ERR_SUCCESS) return rv;

                    retval += (size_t) sz;
                }
                break;
            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default:
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unhandled type '%s' for attribute '%s', unable to compute size",
                    cur->type_name,
                    cur->name);
        }
    }

    *out = retval;
    return rv;
}